

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasmFPU_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmFGeneric<(moira::Instr)245,(moira::Mode)0,0>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *pSVar1;
  Fp local_60 [2];
  Fp local_58;
  int local_54;
  Ffmt local_50 [2];
  Ea<(moira::Mode)0,_4> local_48;
  int local_34;
  Ffmt local_30;
  byte local_2b;
  byte local_2a;
  byte local_29;
  u32 local_28;
  u8 dst;
  u8 src;
  u8 reg;
  u32 ext;
  u16 op_local;
  u32 *addr_local;
  StrWriter *str_local;
  Moira *this_local;
  
  _src = op;
  _ext = addr;
  addr_local = (u32 *)str;
  str_local = (StrWriter *)this;
  local_28 = dasmIncRead<2>(this,addr);
  local_29 = (byte)_src & 7;
  local_2a = (byte)(local_28 >> 10) & 7;
  local_2b = (byte)(local_28 >> 7) & 7;
  if ((local_28 & 0x4000) == 0) {
    pSVar1 = StrWriter::operator<<((StrWriter *)addr_local);
    Ffmt::Ffmt(local_50,2);
    pSVar1 = StrWriter::operator<<(pSVar1,local_50[0]);
    local_54 = addr_local[0xe];
    pSVar1 = StrWriter::operator<<(pSVar1,(Tab)local_54);
    Fp::Fp(&local_58,(uint)local_2a);
    StrWriter::operator<<(pSVar1,local_58);
  }
  else {
    pSVar1 = StrWriter::operator<<((StrWriter *)addr_local);
    Ffmt::Ffmt(&local_30,(uint)local_2a);
    pSVar1 = StrWriter::operator<<(pSVar1,local_30);
    local_34 = addr_local[0xe];
    pSVar1 = StrWriter::operator<<(pSVar1,(Tab)local_34);
    Op<(moira::Mode)0,4>(&local_48,this,(ushort)local_29,_ext);
    StrWriter::operator<<(pSVar1,&local_48);
  }
  pSVar1 = StrWriter::operator<<((StrWriter *)addr_local);
  Fp::Fp(local_60,(uint)local_2b);
  StrWriter::operator<<(pSVar1,local_60[0]);
  return;
}

Assistant:

void
Moira::dasmFGeneric(StrWriter &str, u32 &addr, u16 op) const
{
    auto ext = dasmIncRead(addr);
    auto reg = _____________xxx (op);
    auto src = ___xxx__________ (ext);
    auto dst = ______xxx_______ (ext);

    if (ext & 0x4000) {

        if (M == Mode::IM) {

            u64 val;

            switch (src) {

                case 0: // Long-Word Integer

                    val = dasmIncRead<Long>(addr);
                    str << Ins<I>{} << Ffmt{src} << str.tab << Ims<Long>(u32(val));
                    break;

                case 1: // Single precision

                    val = dasmIncRead<Long>(addr);
                    str << Ins<I>{} << Ffmt{src} << str.tab << "#<fixme>";
                    break;

                case 2: // Double precision
                case 3: // Packed-Decimal Real

                    val = dasmIncRead<Long>(addr);
                    dasmIncRead<Long>(addr);
                    dasmIncRead<Long>(addr); // Why???
                    str << Ins<I>{} << Ffmt{src} << str.tab << "#<fixme>";
                    break;

                case 5: // Double-precision real

                    val = dasmIncRead<Long>(addr);
                    dasmIncRead<Long>(addr);
                    str << Ins<I>{} << Ffmt{src} << str.tab << "#<fixme>";
                    break;

                case 6: // Byte Integer
                    val = dasmIncRead<Word>(addr);
                    str << Ins<I>{} << Ffmt{src} << str.tab << Ims<Byte>(u32(val));
                    break;

                default:
                    str << Ins<I>{} << Ffmt{src} << str.tab << Op<M, Word>(reg, addr);
            }
        } else {
            str << Ins<I>{} << Ffmt{src} << str.tab << Op<M, Long>(reg, addr);
        }

    } else {
        str << Ins<I>{} << Ffmt{2} << str.tab << Fp{src};
    }

    str << Sep{} << Fp{dst};
}